

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

char * rsa2_invalid(ssh_key *key,uint flags)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  ssh_hashalg *halg;
  
  sVar1 = mp_get_nbits((mp_int *)key[-7].vt);
  if ((flags & 4) == 0) {
    halg = &ssh_sha1;
  }
  else {
    halg = &ssh_sha512;
  }
  if ((flags & 2) != 0) {
    halg = &ssh_sha256;
  }
  sVar2 = rsa_pkcs1_length_of_fixed_parts(halg);
  if (sVar1 + 7 >> 3 < sVar2) {
    pcVar3 = "rsa-sha2-512";
    if ((flags & 4) == 0) {
      pcVar3 = "ssh-rsa";
    }
    pcVar4 = "rsa-sha2-256";
    if ((flags & 2) == 0) {
      pcVar4 = pcVar3;
    }
    pcVar3 = dupprintf("%zu-bit RSA key is too short to generate %s signatures",sVar1,pcVar4);
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

static char *rsa2_invalid(ssh_key *key, unsigned flags)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);
    size_t bits = mp_get_nbits(rsa->modulus), nbytes = (bits + 7) / 8;
    const char *sign_alg_name;
    const ssh_hashalg *halg = rsa2_hash_alg_for_flags(flags, &sign_alg_name);
    if (nbytes < rsa_pkcs1_length_of_fixed_parts(halg)) {
        return dupprintf(
            "%"SIZEu"-bit RSA key is too short to generate %s signatures",
            bits, sign_alg_name);
    }

    return NULL;
}